

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yymatchClass(GREG *G,uchar *bits,char *cclass)

{
  int iVar1;
  bool bVar2;
  int c;
  char *cclass_local;
  uchar *bits_local;
  GREG *G_local;
  
  if ((G->limit <= G->pos) && (iVar1 = yyrefill(G), iVar1 == 0)) {
    return 0;
  }
  bVar2 = ((uint)bits[(int)(uint)(byte)G->buf[G->pos] >> 3] & 1 << (G->buf[G->pos] & 7U)) != 0;
  if (bVar2) {
    G->pos = G->pos + 1;
  }
  G_local._4_4_ = (uint)bVar2;
  return G_local._4_4_;
}

Assistant:

YY_LOCAL(int) yymatchClass(GREG *G, const unsigned char *bits, const char *cclass)
{
  int c;
  if (G->pos >= G->limit && !yyrefill(G)) return 0;
  c= (unsigned char)G->buf[G->pos];
  if (bits[c >> 3] & (1 << (c & 7)))
    {
      ++G->pos;
      yyprintf((stderr, "  ok   yymatchClass [%s]", cclass));
      yyprintfGcontext;
      yyprintf((stderr, "\n"));
      return 1;
    }
  yyprintfv((stderr, "  fail yymatchClass [%s]", cclass));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));
  return 0;
}